

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O2

char * next_token(char *s,char delim)

{
  char *pcVar1;
  
  if ((s == (char *)0x0) && (s = next_token::p, next_token::p == (char *)0x0)) {
    return (char *)0x0;
  }
  pcVar1 = strchr(s,(int)delim);
  if (pcVar1 == (char *)0x0) {
    next_token::p = (char *)0x0;
  }
  else {
    *pcVar1 = '\0';
    next_token::p = pcVar1 + 1;
  }
  pcVar1 = trim(s);
  return pcVar1;
}

Assistant:

char * next_token( char * s, char delim )
{
    static char * p = NULL;
    char * rc;

    if ( s != NULL )
    {
        /* Re-init the to-be-tokenized string */
        p = s;
    }

    /* Remembering the start of the next token */
    rc = p;

    /* In case the function has not been initialized, or the previous
       string been exhaused, do nothing.
    */
    if ( p )
    {
        /* Re-using s here */
        if ( ( s = strchr( p, delim ) ) )
        {
            /* Null the delimiter */
            *s = '\0';
            /* Make the internal, static pointer point to the next token */
            p = s + 1;
        }
        else
        {
            /* Delimiter not found, end-of-string reached. */
            p = NULL;
        }

        /* Trim the result */
        rc = trim( rc );
    }

    return rc;
}